

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall icu_63::double_conversion::Bignum::SubtractBignum(Bignum *this,Bignum *other)

{
  uint *puVar1;
  long lVar2;
  uint *puVar3;
  long lVar4;
  uint uVar5;
  
  Align(this,other);
  puVar3 = (this->bigits_).start_;
  puVar1 = (other->bigits_).start_;
  lVar2 = (long)other->exponent_ * 4 + (long)this->exponent_ * -4;
  uVar5 = 0;
  for (lVar4 = 0; lVar4 < other->used_digits_; lVar4 = lVar4 + 1) {
    uVar5 = *(int *)((long)puVar3 + lVar2) - (uVar5 + puVar1[lVar4]);
    *(uint *)((long)puVar3 + lVar2) = uVar5 & 0xfffffff;
    uVar5 = uVar5 >> 0x1f;
    lVar2 = lVar2 + 4;
  }
  puVar3 = (uint *)(lVar2 + (long)(this->bigits_).start_);
  for (; uVar5 != 0; uVar5 = uVar5 - 1 >> 0x1f) {
    uVar5 = *puVar3;
    *puVar3 = uVar5 - 1 & 0xfffffff;
    puVar3 = puVar3 + 1;
  }
  Clamp(this);
  return;
}

Assistant:

void Bignum::SubtractBignum(const Bignum& other) {
  ASSERT(IsClamped());
  ASSERT(other.IsClamped());
  // We require this to be bigger than other.
  ASSERT(LessEqual(other, *this));

  Align(other);

  int offset = other.exponent_ - exponent_;
  Chunk borrow = 0;
  int i;
  for (i = 0; i < other.used_digits_; ++i) {
    ASSERT((borrow == 0) || (borrow == 1));
    Chunk difference = bigits_[i + offset] - other.bigits_[i] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  while (borrow != 0) {
    Chunk difference = bigits_[i + offset] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
    ++i;
  }
  Clamp();
}